

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

vector_t *** gauden_alloc_param(uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  ulong uVar1;
  vector_t ***ppppfVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong d2;
  
  d2 = (ulong)n_feat;
  iVar5 = 0;
  for (uVar1 = 0; d2 != uVar1; uVar1 = uVar1 + 1) {
    iVar5 = iVar5 + veclen[uVar1];
  }
  ppppfVar2 = (vector_t ***)
              __ckd_calloc_3d__((ulong)n_cb,d2,(ulong)n_density,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0xd1);
  pvVar3 = __ckd_calloc__((ulong)(n_density * n_cb * iVar5),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0xd4);
  uVar4 = 0;
  for (uVar1 = 0; uVar1 != n_cb; uVar1 = uVar1 + 1) {
    for (uVar6 = 0; uVar6 != d2; uVar6 = uVar6 + 1) {
      for (uVar7 = 0; n_density != uVar7; uVar7 = uVar7 + 1) {
        ppppfVar2[uVar1][uVar6][uVar7] = (vector_t)((long)pvVar3 + (ulong)uVar4 * 4);
        uVar4 = uVar4 + veclen[uVar6];
      }
    }
  }
  return ppppfVar2;
}

Assistant:

vector_t ***
gauden_alloc_param(uint32 n_cb,
		   uint32 n_feat,
		   uint32 n_density,
		   const uint32 *veclen)
{
    uint32 blksize;
    vector_t ***param;
    float32 *buf;
    uint32 i, j, k, l;

    for (blksize = 0, j = 0; j < n_feat; j++)
	blksize += veclen[j];

    param = (vector_t ***) ckd_calloc_3d(n_cb, n_feat, n_density,
					 sizeof(vector_t));
    
    buf = ckd_calloc(n_cb * n_density * blksize,
		     sizeof(float32));

    for (i = 0, l = 0; i < n_cb; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		param[i][j][k] = &buf[l];

		l += veclen[j];
	    }
	}
    }
    
    return param;
}